

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushID(int int_id)

{
  ImGuiID local_24;
  ImGuiWindow *pIStack_20;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  int int_id_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_20 = GImGui->CurrentWindow;
  g._4_4_ = int_id;
  local_24 = ImGuiWindow::GetID(pIStack_20,int_id);
  ImVector<unsigned_int>::push_back(&pIStack_20->IDStack,&local_24);
  return;
}

Assistant:

void ImGui::PushID(int int_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(int_id);
    window->IDStack.push_back(id);
}